

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module_instrumentation.cpp
# Opt level: O2

Id dxil_spv::build_assume_true_call_function
             (SPIRVModule *module,InstructionInstrumentationState *instrumentation)

{
  Block *elseBlock;
  Block *pBVar1;
  Id IVar2;
  Id IVar3;
  Id returnType;
  Builder *this;
  Function *parent;
  _Head_base<0UL,_spv::Instruction_*,_false> local_c8;
  Block *entry;
  uint local_b8;
  Id bool_type;
  InstructionInstrumentationState *local_b0;
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  local_a8;
  Block *local_88;
  Block *local_80;
  SPIRVModule *local_78;
  Block *local_70;
  _Head_base<0UL,_spv::Instruction_*,_false> local_68;
  _Head_base<0UL,_spv::Instruction_*,_false> local_60;
  _Head_base<0UL,_spv::Instruction_*,_false> local_58;
  undefined4 local_4c;
  _Head_base<0UL,_spv::Instruction_*,_false> local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_b0 = instrumentation;
  local_78 = module;
  this = SPIRVModule::get_builder(module);
  local_70 = this->buildPoint;
  entry = (Block *)0x0;
  IVar2 = spv::Builder::makeBoolType(this);
  bool_type = IVar2;
  IVar3 = spv::Builder::makeUintType(this,0x20);
  returnType = spv::Builder::makeVoidType(this);
  local_48._M_head_impl = (Instruction *)0x0;
  uStack_40 = 0;
  local_38 = 0;
  local_c8._M_head_impl._0_4_ = IVar2;
  local_c8._M_head_impl._4_4_ = IVar3;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_48,
             &local_c8);
  local_a8.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parent = spv::Builder::makeFunctionEntry
                     (this,DecorationMax,returnType,"AssumeTrue",(Vector<Id> *)&local_48,&local_a8,
                      &entry);
  std::
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ::~vector(&local_a8);
  std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)&local_48)
  ;
  spv::Builder::addName
            (this,(*(parent->parameterInstructions).
                    super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start)->resultId,"value");
  spv::Builder::addName
            (this,(parent->parameterInstructions).
                  super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[1]->resultId,"inst");
  local_88 = (Block *)allocate_in_thread(0x78);
  IVar2 = this->uniqueId + 1;
  this->uniqueId = IVar2;
  spv::Block::Block(local_88,IVar2,parent);
  local_80 = (Block *)allocate_in_thread(0x78);
  IVar2 = this->uniqueId + 1;
  this->uniqueId = IVar2;
  spv::Block::Block(local_80,IVar2,parent);
  IVar2 = this->uniqueId + 1;
  this->uniqueId = IVar2;
  local_a8.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_a8.
                         super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar2);
  local_c8._M_head_impl._0_4_ = 0xa8;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
            ((uint *)&local_48,(uint *)&local_a8,&bool_type);
  spv::Instruction::addIdOperand
            (local_48._M_head_impl,
             (*(parent->parameterInstructions).
               super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_start)->resultId);
  local_c8._M_head_impl._0_4_ = this->uniqueId + 1;
  this->uniqueId = (Id)local_c8._M_head_impl;
  local_b8 = 0x3d;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
            ((uint *)&local_a8,(uint *)&local_c8,&bool_type);
  spv::Instruction::addIdOperand
            ((Instruction *)
             local_a8.
             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,local_b0->should_report_instrumentation_id);
  local_b8 = this->uniqueId + 1;
  this->uniqueId = local_b8;
  local_4c = 0xa7;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
            ((uint *)&local_c8,&local_b8,&bool_type);
  spv::Instruction::addIdOperand(local_c8._M_head_impl,(local_48._M_head_impl)->resultId);
  spv::Instruction::addIdOperand
            (local_c8._M_head_impl,
             *(Id *)((long)local_a8.
                           super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 8));
  IVar2 = (local_c8._M_head_impl)->resultId;
  local_58._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (Instruction *)0x0;
  spv::Block::addInstruction
            (entry,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_58
            );
  if (local_58._M_head_impl != (Instruction *)0x0) {
    (*(local_58._M_head_impl)->_vptr_Instruction[1])();
  }
  local_58._M_head_impl = (Instruction *)0x0;
  local_60._M_head_impl =
       (Instruction *)
       local_a8.
       super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_a8.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  spv::Block::addInstruction
            (entry,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_60
            );
  if (local_60._M_head_impl != (Instruction *)0x0) {
    (*(local_60._M_head_impl)->_vptr_Instruction[1])();
  }
  local_60._M_head_impl = (Instruction *)0x0;
  local_68._M_head_impl = local_c8._M_head_impl;
  local_c8._M_head_impl = (Instruction *)0x0;
  spv::Block::addInstruction
            (entry,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_68
            );
  if (local_68._M_head_impl != (Instruction *)0x0) {
    (*(local_68._M_head_impl)->_vptr_Instruction[1])();
  }
  elseBlock = local_88;
  local_68._M_head_impl = (Instruction *)0x0;
  spv::Builder::createSelectionMerge(this,local_88,0);
  pBVar1 = local_80;
  spv::Builder::createConditionalBranch(this,IVar2,local_80,elseBlock);
  this->buildPoint = pBVar1;
  emit_instrumentation_hash
            (local_78,local_b0,parent,0,
             (parent->parameterInstructions).
             super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_start[1]->resultId);
  spv::Builder::createBranch(this,elseBlock);
  this->buildPoint = elseBlock;
  spv::Builder::makeReturn(this,false,0);
  this->buildPoint = local_70;
  IVar2 = (parent->functionInstruction).resultId;
  if (local_c8._M_head_impl != (Instruction *)0x0) {
    (*(local_c8._M_head_impl)->_vptr_Instruction[1])();
  }
  if (local_a8.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)(*(long *)local_a8.
                          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 8))();
  }
  if (local_48._M_head_impl != (Instruction *)0x0) {
    (*(local_48._M_head_impl)->_vptr_Instruction[1])();
  }
  return IVar2;
}

Assistant:

spv::Id build_assume_true_call_function(SPIRVModule &module, const InstructionInstrumentationState &instrumentation)
{
	auto &builder = module.get_builder();

	// Use normal bb->addInstruction here since we don't want to instrument the code that is doing instrumentation :')
	auto *current_build_point = builder.getBuildPoint();
	spv::Block *entry = nullptr;
	spv::Id bool_type = builder.makeBoolType();
	spv::Id u32_type = builder.makeUintType(32);

	auto *func = builder.makeFunctionEntry(spv::NoPrecision, builder.makeVoidType(),
	                                       "AssumeTrue",
	                                       { bool_type, u32_type }, {}, &entry);

	builder.addName(func->getParamId(0), "value");
	builder.addName(func->getParamId(1), "inst");

	auto *merge_block = new spv::Block(builder.getUniqueId(), *func);
	auto *fail_block = new spv::Block(builder.getUniqueId(), *func);

	auto should_report = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpLogicalNot);
	should_report->addIdOperand(func->getParamId(0));

	auto loaded = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpLoad);
	loaded->addIdOperand(instrumentation.should_report_instrumentation_id);

	auto will_report = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpLogicalAnd);
	will_report->addIdOperand(should_report->getResultId());
	will_report->addIdOperand(loaded->getResultId());

	spv::Id cond_id = will_report->getResultId();

	entry->addInstruction(std::move(should_report));
	entry->addInstruction(std::move(loaded));
	entry->addInstruction(std::move(will_report));

	builder.createSelectionMerge(merge_block, 0);
	builder.createConditionalBranch(cond_id, fail_block, merge_block);

	builder.setBuildPoint(fail_block);
	{
		// Dummy value is stored.
		emit_instrumentation_hash(module, instrumentation, func, 0, func->getParamId(1));
		builder.createBranch(merge_block);
	}

	builder.setBuildPoint(merge_block);
	builder.makeReturn(false);
	builder.setBuildPoint(current_build_point);
	return func->getId();
}